

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

Statement *
slang::ast::Statement::bindItems
          (SyntaxList<slang::syntax::SyntaxNode> *items,ASTContext *context,
          StatementContext *stmtCtx)

{
  SyntaxNode *this;
  bool bVar1;
  int iVar2;
  reference ppSVar3;
  undefined4 extraout_var;
  size_type sVar4;
  reference ppSVar5;
  Compilation *this_00;
  undefined8 in_RDX;
  EVP_PKEY_CTX *src;
  sockaddr *in_RSI;
  Compilation *comp;
  SyntaxNode *item;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::SyntaxNode> *__range2;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> *in_stack_fffffffffffffee8;
  SmallVectorBase<const_slang::ast::Statement_*> *in_stack_fffffffffffffef0;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> *in_stack_fffffffffffffef8;
  SourceRange *in_stack_ffffffffffffff10;
  span<const_slang::ast::Statement_*,_18446744073709551615UL> *in_stack_ffffffffffffff18;
  StatementSyntax *in_stack_ffffffffffffff20;
  SmallVectorBase<const_slang::ast::Statement_*> *in_stack_ffffffffffffff78;
  __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffff80;
  SmallVectorBase<const_slang::ast::Statement_*> local_60 [2];
  undefined8 local_20;
  sockaddr *local_18;
  StatementList *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  SmallVector<const_slang::ast::Statement_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Statement_*,_5UL> *)0x760d51);
  bindScopeInitializers
            ((ASTContext *)in_stack_ffffffffffffff80._M_current,in_stack_ffffffffffffff78);
  std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::begin(in_stack_fffffffffffffee8);
  std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::end(in_stack_fffffffffffffef8);
  while (bVar1 = __gnu_cxx::
                 operator==<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffef0,
                            (__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffee8), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppSVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffff80);
    this = *ppSVar3;
    bVar1 = slang::syntax::StatementSyntax::isKind(this->kind);
    if (bVar1) {
      in_stack_ffffffffffffff20 =
           slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(this);
      iVar2 = bind((int)in_stack_ffffffffffffff20,local_18,(socklen_t)local_20);
      in_stack_ffffffffffffff18 =
           (span<const_slang::ast::Statement_*,_18446744073709551615UL> *)
           CONCAT44(extraout_var,iVar2);
      SmallVectorBase<const_slang::ast::Statement_*>::push_back
                (in_stack_fffffffffffffef0,(Statement **)in_stack_fffffffffffffee8);
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffff80);
  }
  sVar4 = SmallVectorBase<const_slang::ast::Statement_*>::size(local_60);
  if (sVar4 == 1) {
    ppSVar5 = SmallVectorBase<const_slang::ast::Statement_*>::operator[](local_60,0);
    local_8 = (StatementList *)*ppSVar5;
  }
  else {
    this_00 = ASTContext::getCompilation((ASTContext *)0x760ef3);
    SmallVectorBase<const_slang::ast::Statement_*>::copy(local_60,(EVP_PKEY_CTX *)this_00,src);
    SourceRange::SourceRange((SourceRange *)this_00);
    local_8 = BumpAllocator::
              emplace<slang::ast::StatementList,std::span<slang::ast::Statement_const*,18446744073709551615ul>,slang::SourceRange>
                        ((BumpAllocator *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         in_stack_ffffffffffffff10);
  }
  SmallVector<const_slang::ast::Statement_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Statement_*,_5UL> *)0x760f82);
  return &local_8->super_Statement;
}

Assistant:

const Statement& Statement::bindItems(const SyntaxList<SyntaxNode>& items,
                                      const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Statement*> buffer;
    bindScopeInitializers(context, buffer);

    for (auto item : items) {
        if (StatementSyntax::isKind(item->kind)) {
            buffer.push_back(&bind(item->as<StatementSyntax>(), context, stmtCtx,
                                   /* inList */ true));
        }
    }

    if (buffer.size() == 1)
        return *buffer[0];

    auto& comp = context.getCompilation();
    return *comp.emplace<StatementList>(buffer.copy(comp), SourceRange());
}